

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_get_lengths(wally_tx *tx,tx_serialize_opts *opts,uint32_t flags,size_t *base_size,
                  size_t *witness_size,size_t *witness_count,_Bool is_elements)

{
  wally_tx_input *pwVar1;
  wally_tx_output *pwVar2;
  _Bool _Var3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint64_t local_150;
  uint64_t local_148;
  uint64_t local_140;
  ulong local_120;
  uint64_t local_110;
  size_t local_108;
  uint64_t local_f8;
  long local_d8;
  wally_tx_witness_item *stack_2;
  size_t num_items_1;
  wally_tx_input *input_2;
  wally_tx_output *output_1;
  wally_tx_witness_item *stack_1;
  wally_tx_witness_item *stack;
  size_t num_items;
  wally_tx_input *input_1;
  wally_tx_output *output;
  size_t num_outputs;
  wally_tx_input *input;
  _Bool sh_single;
  _Bool sh_none;
  _Bool sh_rangeproof;
  ulong uStack_60;
  _Bool anyonecanpay;
  size_t j;
  size_t i;
  size_t n;
  _Bool is_elements_local;
  size_t *witness_count_local;
  size_t *witness_size_local;
  size_t *base_size_local;
  uint32_t flags_local;
  tx_serialize_opts *opts_local;
  wally_tx *tx_local;
  
  bVar9 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar9 = (opts->sighash & 0x80) != 0;
  }
  bVar10 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar10 = (opts->sighash & 0x40) != 0;
  }
  bVar11 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar11 = (opts->sighash & 0x1f) == 2;
  }
  bVar12 = false;
  if (opts != (tx_serialize_opts *)0x0) {
    bVar12 = (opts->sighash & 0x1f) == 3;
  }
  *witness_count = 0;
  _Var3 = is_valid_tx(tx);
  if (!_Var3) {
    return -2;
  }
  if (opts != (tx_serialize_opts *)0x0) {
    if ((flags & 1) != 0) {
      return -1;
    }
    if ((opts->bip143 & 1U) != 0) {
      sVar5 = varbuff_get_length(opts->script_len);
      if (is_elements) {
        sVar6 = confidential_value_length_from_bytes(opts->value);
        local_d8 = sVar6 + 0x20;
      }
      else {
        local_d8 = 8;
      }
      bVar9 = false;
      if (is_elements) {
        bVar9 = bVar10;
      }
      iVar4 = 0;
      if (bVar9) {
        iVar4 = 0x20;
      }
      *base_size = sVar5 + local_d8 + (long)iVar4 + 0x94;
      if ((tx->inputs[opts->index].features & 2) != 0) {
        sVar5 = confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount);
        sVar6 = confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
        *base_size = sVar5 + 0x40 + sVar6 + *base_size;
      }
      *witness_size = 0;
      return 0;
    }
  }
  if (((flags & 0xfffffff0) == 0) &&
     (((flags & 1) == 0 || (iVar4 = wally_tx_get_witness_count(tx,witness_count), iVar4 == 0)))) {
    base_size_local._4_4_ = flags;
    if (*witness_count == 0) {
      base_size_local._4_4_ = 0;
    }
    if (bVar9) {
      local_f8 = 1;
    }
    else {
      local_f8 = tx->num_inputs;
    }
    sVar5 = varint_get_length(local_f8);
    if (bVar11) {
      local_108 = 1;
    }
    else {
      if (bVar12) {
        local_110 = opts->index + 1;
      }
      else {
        local_110 = tx->num_outputs;
      }
      local_108 = varint_get_length(local_110);
    }
    lVar8 = 0;
    if (opts != (tx_serialize_opts *)0x0) {
      lVar8 = 4;
    }
    i = sVar5 + local_108 + 8 + lVar8;
    if ((opts == (tx_serialize_opts *)0x0) && (is_elements)) {
      i = i + 1;
    }
    for (j = 0; j < tx->num_inputs; j = j + 1) {
      pwVar1 = tx->inputs;
      if ((!bVar9) || (j == opts->index)) {
        i = i + 0x28;
        if ((pwVar1[j].features & 2) != 0) {
          sVar5 = confidential_value_length_from_bytes(pwVar1[j].issuance_amount);
          sVar6 = confidential_value_length_from_bytes(pwVar1[j].inflation_keys);
          i = sVar5 + 0x40 + sVar6 + i;
        }
        if (opts == (tx_serialize_opts *)0x0) {
          sVar5 = varbuff_get_length(pwVar1[j].script_len);
          i = sVar5 + i;
        }
        else if (j == opts->index) {
          sVar5 = varbuff_get_length(opts->script_len);
          i = sVar5 + i;
        }
        else {
          i = i + 1;
        }
      }
    }
    if (!bVar11) {
      if (bVar12) {
        local_120 = opts->index + 1;
      }
      else {
        local_120 = tx->num_outputs;
      }
      for (j = 0; j < local_120; j = j + 1) {
        pwVar2 = tx->outputs;
        if ((bVar12) && (j != opts->index)) {
          i = i + 9;
        }
        else {
          if ((is_elements) && ((pwVar2[j].features & 1) != 0)) {
            sVar5 = confidential_asset_length_from_bytes(pwVar2[j].asset);
            sVar6 = confidential_value_length_from_bytes(pwVar2[j].value);
            sVar7 = confidential_nonce_length_from_bytes(pwVar2[j].nonce);
            i = sVar5 + sVar6 + sVar7 + i;
          }
          else {
            i = i + 8;
          }
          sVar5 = varbuff_get_length(pwVar2[j].script_len);
          i = sVar5 + i;
          if ((is_elements) && (bVar10)) {
            sVar5 = varbuff_get_length(pwVar2[j].rangeproof_len);
            sVar6 = varbuff_get_length(pwVar2[j].surjectionproof_len);
            i = sVar5 + sVar6 + i;
          }
        }
      }
    }
    *base_size = i;
    i = 0;
    if ((base_size_local._4_4_ & 1) != 0) {
      if (is_elements) {
        for (j = 0; j < tx->num_inputs; j = j + 1) {
          pwVar1 = tx->inputs;
          sVar5 = varbuff_get_length(pwVar1[j].issuance_amount_rangeproof_len);
          sVar6 = varbuff_get_length(pwVar1[j].inflation_keys_rangeproof_len);
          if (pwVar1[j].witness == (wally_tx_witness_stack *)0x0) {
            local_140 = 0;
          }
          else {
            local_140 = (pwVar1[j].witness)->num_items;
          }
          sVar7 = varint_get_length(local_140);
          i = sVar7 + sVar6 + sVar5 + i;
          for (uStack_60 = 0; uStack_60 < local_140; uStack_60 = uStack_60 + 1) {
            sVar5 = varbuff_get_length((pwVar1[j].witness)->items[uStack_60].witness_len);
            i = sVar5 + i;
          }
          if (pwVar1[j].pegin_witness == (wally_tx_witness_stack *)0x0) {
            local_148 = 0;
          }
          else {
            local_148 = (pwVar1[j].pegin_witness)->num_items;
          }
          sVar5 = varint_get_length(local_148);
          i = sVar5 + i;
          for (uStack_60 = 0; uStack_60 < local_148; uStack_60 = uStack_60 + 1) {
            sVar5 = varbuff_get_length((pwVar1[j].pegin_witness)->items[uStack_60].witness_len);
            i = sVar5 + i;
          }
        }
        for (j = 0; j < tx->num_outputs; j = j + 1) {
          pwVar2 = tx->outputs;
          sVar5 = varbuff_get_length(pwVar2[j].surjectionproof_len);
          sVar6 = varbuff_get_length(pwVar2[j].rangeproof_len);
          i = sVar6 + sVar5 + i;
        }
      }
      else {
        i = 2;
        for (j = 0; j < tx->num_inputs; j = j + 1) {
          pwVar1 = tx->inputs;
          if (pwVar1[j].witness == (wally_tx_witness_stack *)0x0) {
            local_150 = 0;
          }
          else {
            local_150 = (pwVar1[j].witness)->num_items;
          }
          sVar5 = varint_get_length(local_150);
          i = sVar5 + i;
          for (uStack_60 = 0; uStack_60 < local_150; uStack_60 = uStack_60 + 1) {
            sVar5 = varbuff_get_length((pwVar1[j].witness)->items[uStack_60].witness_len);
            i = sVar5 + i;
          }
        }
      }
    }
    *witness_size = i;
    tx_local._4_4_ = 0;
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

static int tx_get_lengths(const struct wally_tx *tx,
                          const struct tx_serialize_opts *opts, uint32_t flags,
                          size_t *base_size, size_t *witness_size,
                          size_t *witness_count, bool is_elements)
{
    size_t n, i, j;
    const bool anyonecanpay = opts && opts->sighash & WALLY_SIGHASH_ANYONECANPAY;
    const bool sh_rangeproof = opts && opts->sighash & WALLY_SIGHASH_RANGEPROOF;
    const bool sh_none = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_NONE;
    const bool sh_single = opts && (opts->sighash & SIGHASH_MASK) == WALLY_SIGHASH_SINGLE;

    *witness_count = 0;

    if (!is_valid_tx(tx))
        return WALLY_EINVAL;

    if (opts) {
        if (flags & WALLY_TX_FLAG_USE_WITNESS)
            return WALLY_ERROR; /* Segwit tx hashing uses bip143 opts member */

        if (opts->bip143) {
            *base_size = sizeof(uint32_t) + /* version */
                         SHA256_LEN + /* hash prevouts */
                         SHA256_LEN + /* hash sequence */
                         WALLY_TXHASH_LEN + sizeof(uint32_t) + /* outpoint + index */
                         varbuff_get_length(opts->script_len) + /* script */
                         (is_elements ? confidential_value_length_from_bytes(opts->value) + SHA256_LEN :
                          sizeof(uint64_t)) + /* amount */
                         sizeof(uint32_t) + /* input sequence */
                         SHA256_LEN + /* hash outputs */
                         ((is_elements && sh_rangeproof) ? SHA256_LEN : 0) + /* rangeproof */
                         sizeof(uint32_t) + /* nlocktime */
                         sizeof(uint32_t); /* tx sighash */
#ifdef BUILD_ELEMENTS
            if (tx->inputs[opts->index].features & WALLY_TX_IS_ISSUANCE)
                *base_size += 2 * WALLY_TX_ASSET_TAG_LEN +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].issuance_amount) +
                              confidential_value_length_from_bytes(tx->inputs[opts->index].inflation_keys);
#endif
            *witness_size = 0;
            return WALLY_OK;
        }
    }

    if ((flags & ~WALLY_TX_ALL_FLAGS) ||
        ((flags & WALLY_TX_FLAG_USE_WITNESS) &&
         wally_tx_get_witness_count(tx, witness_count) != WALLY_OK))
        return WALLY_EINVAL;

    if (!*witness_count)
        flags &= ~WALLY_TX_FLAG_USE_WITNESS;

    n = sizeof(tx->version) +
        varint_get_length(anyonecanpay ? 1 : tx->num_inputs) +
        (sh_none ? 1 : varint_get_length(sh_single ? opts->index + 1 : tx->num_outputs)) +
        sizeof(tx->locktime) +
        (opts ? sizeof(leint32_t) : 0); /* Include trailing tx_sighash */

    if (!opts && is_elements)
        n += sizeof(uint8_t); /* witness flag */
    for (i = 0; i < tx->num_inputs; ++i) {
        const struct wally_tx_input *input = tx->inputs + i;
        if (anyonecanpay && i != opts->index)
            continue; /* anyonecanpay only signs the given index */

        n += sizeof(input->txhash) +
             sizeof(input->index) +
             sizeof(input->sequence);

#ifdef BUILD_ELEMENTS
        if (input->features & WALLY_TX_IS_ISSUANCE) {
            n += sizeof(input->blinding_nonce) +
                 sizeof(input->entropy) +
                 confidential_value_length_from_bytes(input->issuance_amount) +
                 confidential_value_length_from_bytes(input->inflation_keys);
        }
#endif

        if (opts) {
            if (i == opts->index)
                n += varbuff_get_length(opts->script_len);
            else
                ++n;
        } else
            n += varbuff_get_length(input->script_len);

    }

    if (!sh_none) {
        size_t num_outputs = sh_single ? opts->index + 1 : tx->num_outputs;

        for (i = 0; i < num_outputs; ++i) {
            const struct wally_tx_output *output = tx->outputs + i;
            if (sh_single && i != opts->index)
                n += sizeof(EMPTY_OUTPUT);
            else {
                if (is_elements && (output->features & WALLY_TX_IS_ELEMENTS)) {
#ifdef BUILD_ELEMENTS
                    n += confidential_asset_length_from_bytes(output->asset) +
                         confidential_value_length_from_bytes(output->value) +
                         confidential_nonce_length_from_bytes(output->nonce);
#endif
                } else
                    n += sizeof(output->satoshi);
                n += varbuff_get_length(output->script_len);

#ifdef BUILD_ELEMENTS
                if (is_elements && sh_rangeproof) {
                    n += varbuff_get_length(output->rangeproof_len) +
                         varbuff_get_length(output->surjectionproof_len);
                }
#endif /* BUILD_ELEMENTS */
            }
        }
    }

    *base_size = n;

    n = 0;
    if (flags & WALLY_TX_FLAG_USE_WITNESS) {
        if (is_elements) {
#ifdef BUILD_ELEMENTS
            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items;
                n += varbuff_get_length(input->issuance_amount_rangeproof_len);
                n += varbuff_get_length(input->inflation_keys_rangeproof_len);
                num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
                num_items = input->pegin_witness ? input->pegin_witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->pegin_witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }

            for (i = 0; i < tx->num_outputs; ++i) {
                const struct wally_tx_output *output = tx->outputs + i;
                n += varbuff_get_length(output->surjectionproof_len);
                n += varbuff_get_length(output->rangeproof_len);
            }
#endif /* BUILD_ELEMENTS */
        } else {
            n = 2; /* For marker and flag bytes 0x00 0x01 */

            for (i = 0; i < tx->num_inputs; ++i) {
                const struct wally_tx_input *input = tx->inputs + i;
                size_t num_items = input->witness ? input->witness->num_items : 0;
                n += varint_get_length(num_items);
                for (j = 0; j < num_items; ++j) {
                    const struct wally_tx_witness_item *stack;
                    stack = input->witness->items + j;
                    n += varbuff_get_length(stack->witness_len);
                }
            }
        }
    }

    *witness_size = n;
    return WALLY_OK;
}